

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace
          (cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this,cmCommandContext *cc)

{
  cmListFileContext lfc;
  undefined1 local_80 [32];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40;
  string local_38;
  
  local_80._0_8_ = local_80 + 0x10;
  local_80._8_8_ = 0;
  local_80[0x10] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = 0;
  std::__cxx11::string::_M_assign((string *)local_80);
  local_40 = cc->Line;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_38,&this->StateSnapshot);
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmListFileBacktrace::Push(__return_storage_ptr__,&this->Backtrace,(cmListFileContext *)local_80);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_80);
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace(cmCommandContext const& cc) const
{
  cmListFileContext lfc;
  lfc.Name = cc.Name;
  lfc.Line = cc.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return this->Backtrace.Push(lfc);
}